

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O0

Ray * __thiscall ThinlensCamera::sampleray(ThinlensCamera *this,vec2f pos,Sampler *sampler)

{
  long *in_RDX;
  Ray *in_RDI;
  undefined4 uVar1;
  undefined8 extraout_XMM0_Qb;
  vec3f vVar2;
  vec3f d;
  vec3f focused_rel;
  vec3f aperture_sample;
  vec2f u;
  undefined4 in_stack_fffffffffffffd50;
  vec3f *in_stack_fffffffffffffd58;
  undefined1 auVar3 [16];
  vec3f *a;
  
  uVar1 = (**(code **)(*in_RDX + 0x28))();
  vVar2 = normalized(in_stack_fffffffffffffd58);
  auVar3._8_4_ = (int)extraout_XMM0_Qb;
  auVar3._0_8_ = vVar2._0_8_;
  auVar3._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  ::operator*(vVar2.x,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffd50));
  normalized(auVar3._8_8_);
  ::operator*(auVar3._0_4_,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffd50));
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._0_4_,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffd50));
  ::operator*(auVar3._0_4_,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffd50));
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._0_4_,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffd50));
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._8_8_,auVar3._4_4_);
  vVar2 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  a = auVar3._8_8_;
  ::operator-(a,auVar3._0_8_);
  d = normalized(a);
  Ray::Ray(in_RDI,vVar2,d);
  return in_RDI;
}

Assistant:

Ray sampleray(vec2f pos, Sampler& sampler) const {
		vec2f u = sampler.sampleUnitDisk();
		vec3f aperture_sample = lensradius * (u.x * normalized(lefthalf) + u.y * normalized(uphalf));
		vec3f focused_rel = (dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf) * focaldistance;
		return Ray(position + aperture_sample, normalized(focused_rel - aperture_sample));
	}